

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

int __thiscall nite::UDPSocket::close(UDPSocket *this,int __fd)

{
  int number;
  int number_00;
  string local_e0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  UDPSocket *local_10;
  UDPSocket *this_local;
  
  if ((this->opened & 1U) != 0) {
    local_10 = this;
    close_(this->sock);
    this->opened = false;
    toStr_abi_cxx11_(&local_b0,(nite *)(ulong)this->port,number);
    std::operator+(&local_90,"UDP socket closed at ",&local_b0);
    std::operator+(&local_70,&local_90," (");
    toStr_abi_cxx11_(&local_e0,(nite *)(ulong)(uint)this->sock,number_00);
    std::operator+(&local_50,&local_70,&local_e0);
    std::operator+(&local_30,&local_50,")");
    print(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    this = (UDPSocket *)std::__cxx11::string::~string((string *)&local_b0);
  }
  return (int)this;
}

Assistant:

void nite::UDPSocket::close(){
	if (opened){
		close_(sock);
		opened = false;
		nite::print("UDP socket closed at "+nite::toStr(port)+" ("+nite::toStr(sock)+")");

	}
}